

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer.cc
# Opt level: O0

string * sentencepiece::normalizer::Normalizer::EncodePrecompiledCharsMap_abi_cxx11_
                   (string_view trie_blob,string_view normalized)

{
  const_pointer pvVar1;
  string *in_RDI;
  string *blob;
  string *value;
  string local_50 [39];
  undefined1 local_29;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_29 = 0;
  value = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  string_util::EncodePOD<unsigned_int>((uint *)value);
  std::__cxx11::string::append((string *)value);
  std::__cxx11::string::~string(local_50);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  std::__cxx11::string::append((char *)value,(ulong)pvVar1);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_28);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
  std::__cxx11::string::append((char *)value,(ulong)pvVar1);
  return in_RDI;
}

Assistant:

std::string Normalizer::EncodePrecompiledCharsMap(
    absl::string_view trie_blob, absl::string_view normalized) {
  // <trie size(4byte)><double array trie><normalized string>
  std::string blob;
  blob.append(string_util::EncodePOD<uint32_t>(trie_blob.size()));
  blob.append(trie_blob.data(), trie_blob.size());

#ifdef IS_BIG_ENDIAN
  uint32_t *data = reinterpret_cast<uint32_t *>(blob.data());
  for (int i = 0; i < blob.size() / 4; ++i) data[i] = util::Swap32(data[i]);
#endif

  blob.append(normalized.data(), normalized.size());

  return blob;
}